

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdoptpfor.h
# Opt level: O3

uint32_t __thiscall
FastPForLib::SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_>::tryB
          (SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t b,uint32_t *in,uint32_t len
          )

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  uint32_t *puVar4;
  uint32_t *in_00;
  int iVar5;
  int in_EAX;
  uint uVar6;
  uint32_t uVar7;
  ulong uVar8;
  uint32_t uVar9;
  ulong uVar10;
  uint32_t e;
  size_t encodedExceptions_sz;
  int local_18 [2];
  
  uVar7 = len;
  if (b != 0x20) {
    uVar7 = len * b + 0x1f >> 5;
    if (len != 0) {
      puVar2 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsPositions.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsValues.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      uVar6 = 0;
      do {
        uVar1 = in[uVar10];
        if (uVar1 >> (b & 0x1f) != 0) {
          puVar2[uVar6] = (uint)uVar10;
          puVar3[uVar6] = uVar1 >> (b & 0x1f);
          uVar6 = uVar6 + 1;
        }
        uVar10 = uVar10 + 1;
      } while (len != uVar10);
      if (uVar6 != 0) {
        if (uVar6 - 1 != 0) {
          puVar2 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsPositions.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar10 = (ulong)(uVar6 - 1);
          do {
            uVar8 = uVar10 - 1;
            puVar3 = puVar2 + uVar10;
            *puVar3 = *puVar3 - puVar2[uVar8 & 0xffffffff];
            uVar10 = uVar8;
          } while ((int)uVar8 != 0);
        }
        puVar4 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsPositions.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar2 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsValues.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        in_00 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptions.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
        uVar10 = 0;
        do {
          if (uVar10 == 0) {
            uVar9 = *puVar4;
          }
          else {
            uVar9 = puVar4[uVar10] - 1;
          }
          uVar1 = puVar2[uVar10];
          in_00[uVar10] = uVar9;
          iVar5 = (int)uVar10;
          uVar10 = uVar10 + 1;
          in_00[uVar6 + iVar5] = uVar1 - 1;
        } while (uVar6 != uVar10);
        local_18[0] = in_EAX;
        Simple16<false>::fakeencodeArray
                  (&(this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).ecoder,in_00,
                   (ulong)(uVar6 * 2),(size_t *)local_18);
        uVar7 = uVar7 + local_18[0];
      }
    }
  }
  return uVar7;
}

Assistant:

__attribute__((pure)) uint32_t
SIMDOPTPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::tryB(
    uint32_t b, const uint32_t *in, uint32_t len) {

  assert(b <= 32);
  if (b == 32) {
    return len;
  }
  uint32_t size = div_roundup(len * b, 32);
  uint32_t curExcept = 0;

  for (uint32_t i = 0; i < len; i++) {
    if (in[i] >= (1U << b)) {
      const uint32_t e = in[i] >> b;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                  ExceptionCoder>::exceptionsPositions[curExcept] = i;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                  ExceptionCoder>::exceptionsValues[curExcept] = e;
      curExcept++;
    }
  }

  if (curExcept > 0) {

    for (uint32_t i = curExcept - 1; i > 0; i--) {
      const uint32_t cur = SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                                       ExceptionCoder>::exceptionsPositions[i];
      const uint32_t prev =
          SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                      ExceptionCoder>::exceptionsPositions[i - 1];
      const uint32_t gap = cur - prev;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                  ExceptionCoder>::exceptionsPositions[i] = gap;
    }

    for (uint32_t i = 0; i < curExcept; i++) {
      const uint32_t excPos =
          (i > 0)
              ? SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                            ExceptionCoder>::exceptionsPositions[i] -
                    1
              : SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                            ExceptionCoder>::exceptionsPositions[i];
      const uint32_t excVal = SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                                          ExceptionCoder>::exceptionsValues[i] -
                              1;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::exceptions[i] =
          excPos;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                  ExceptionCoder>::exceptions[i + curExcept] = excVal;
    }
    size_t encodedExceptions_sz;
    SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::ecoder
        .fakeencodeArray(&SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                                      ExceptionCoder>::exceptions[0],
                         2 * curExcept,
                         /*&encodedExceptions[0], */ encodedExceptions_sz);
    size += static_cast<uint32_t>(encodedExceptions_sz);
  }
  return size;
}